

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O2

int __thiscall cmCPackRPMGenerator::PackageComponents(cmCPackRPMGenerator *this,bool ignoreGroup)

{
  _Rb_tree_node_base *packageName;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  cmCPackLog *pcVar3;
  size_t sVar4;
  _Alloc_hider _Var5;
  _Rb_tree_node_base *p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  __type _Var10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  _Rb_tree_node_base *p_Var15;
  ostream *poVar16;
  _Base_ptr p_Var17;
  size_type sVar18;
  size_type sVar19;
  _Rb_tree_node_base *local_268;
  uint local_260;
  string mainComponentUpper;
  string component_4;
  _Rb_tree_node_base *local_218;
  _Rb_tree_node_base *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string initialTopLevel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string component;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_cmCPackGenerator).packageFileNames);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&component,"CPACK_TEMPORARY_DIRECTORY",(allocator<char> *)&mainComponentUpper
            );
  pcVar14 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&component);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&initialTopLevel,pcVar14,(allocator<char> *)&component_4);
  std::__cxx11::string::~string((string *)&component);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&component,"CPACK_RPM_MAIN_COMPONENT",(allocator<char> *)&mainComponentUpper)
  ;
  pcVar14 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&component);
  std::__cxx11::string::~string((string *)&component);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&component,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE",
             (allocator<char> *)&component_4);
  bVar7 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&component);
  if (bVar7) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mainComponentUpper,"CPACK_RPM_DEBUGINFO_PACKAGE",
               (allocator<char> *)&local_208);
    bVar7 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&mainComponentUpper);
    std::__cxx11::string::~string((string *)&mainComponentUpper);
    std::__cxx11::string::~string((string *)&component);
    if (!bVar7) {
      if (ignoreGroup) {
        bVar7 = true;
        for (p_Var15 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_left;
            (_Rb_tree_header *)p_Var15 !=
            &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
            p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
          std::__cxx11::string::string((string *)&component,(string *)(p_Var15 + 1));
          sVar19 = component._M_string_length;
          _Var5 = component._M_dataplus;
          for (sVar18 = 0; sVar19 != sVar18; sVar18 = sVar18 + 1) {
            iVar11 = toupper((int)_Var5._M_p[sVar18]);
            _Var5._M_p[sVar18] = (char)iVar11;
          }
          std::operator+(&component_4,"CPACK_RPM_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var15 + 1));
          std::operator+(&mainComponentUpper,&component_4,"_DEBUGINFO_PACKAGE");
          bVar8 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&mainComponentUpper);
          bVar9 = true;
          if (!bVar8) {
            std::operator+(&local_1c8,"CPACK_RPM_",&component);
            std::operator+(&local_208,&local_1c8,"_DEBUGINFO_PACKAGE");
            bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string((string *)&local_1c8);
          }
          std::__cxx11::string::~string((string *)&mainComponentUpper);
          std::__cxx11::string::~string((string *)&component_4);
          std::__cxx11::string::~string((string *)&component);
          if (bVar9 != false) {
            bVar7 = false;
            break;
          }
        }
      }
      else {
        bVar7 = true;
        for (p_Var15 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                       super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var15 !=
            &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header;
            p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
          std::__cxx11::string::string((string *)&component,(string *)(p_Var15 + 1));
          sVar19 = component._M_string_length;
          _Var5 = component._M_dataplus;
          for (sVar18 = 0; sVar19 != sVar18; sVar18 = sVar18 + 1) {
            iVar11 = toupper((int)_Var5._M_p[sVar18]);
            _Var5._M_p[sVar18] = (char)iVar11;
          }
          std::operator+(&component_4,"CPACK_RPM_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var15 + 1));
          std::operator+(&mainComponentUpper,&component_4,"_DEBUGINFO_PACKAGE");
          bVar8 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&mainComponentUpper);
          bVar9 = true;
          if (!bVar8) {
            std::operator+(&local_1c8,"CPACK_RPM_",&component);
            std::operator+(&local_208,&local_1c8,"_DEBUGINFO_PACKAGE");
            bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string((string *)&local_1c8);
          }
          std::__cxx11::string::~string((string *)&mainComponentUpper);
          std::__cxx11::string::~string((string *)&component_4);
          std::__cxx11::string::~string((string *)&component);
          if (bVar9 != false) {
            bVar7 = false;
            break;
          }
        }
        if (bVar7) {
          for (p_Var17 = (this->super_cmCPackGenerator).Components._M_t._M_impl.
                         super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var17 !=
              &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
              p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
            if (*(long *)(p_Var17 + 4) == 0) {
              std::__cxx11::string::string((string *)&component,(string *)(p_Var17 + 1));
              sVar19 = component._M_string_length;
              _Var5 = component._M_dataplus;
              for (sVar18 = 0; sVar19 != sVar18; sVar18 = sVar18 + 1) {
                iVar11 = toupper((int)_Var5._M_p[sVar18]);
                _Var5._M_p[sVar18] = (char)iVar11;
              }
              std::operator+(&component_4,"CPACK_RPM_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var17 + 1));
              std::operator+(&mainComponentUpper,&component_4,"_DEBUGINFO_PACKAGE");
              bVar8 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&mainComponentUpper);
              bVar9 = true;
              if (!bVar8) {
                std::operator+(&local_1c8,"CPACK_RPM_",&component);
                std::operator+(&local_208,&local_1c8,"_DEBUGINFO_PACKAGE");
                bVar9 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_208);
                std::__cxx11::string::~string((string *)&local_208);
                std::__cxx11::string::~string((string *)&local_1c8);
              }
              std::__cxx11::string::~string((string *)&mainComponentUpper);
              std::__cxx11::string::~string((string *)&component_4);
              std::__cxx11::string::~string((string *)&component);
              if (bVar9 != false) {
                bVar7 = false;
                break;
              }
            }
          }
        }
      }
      if (bVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&component);
        poVar16 = std::operator<<((ostream *)&component,"Setting ");
        poVar16 = std::operator<<(poVar16,"CPACK_RPM_DEBUGINFO_PACKAGE because ");
        poVar16 = std::operator<<(poVar16,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE is set but ");
        poVar16 = std::operator<<(poVar16," none of the ");
        poVar16 = std::operator<<(poVar16,"CPACK_RPM_<component>_DEBUGINFO_PACKAGE variables ");
        poVar16 = std::operator<<(poVar16,"are set.");
        std::endl<char,std::char_traits<char>>(poVar16);
        pcVar3 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar3,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                        ,0xaa,mainComponentUpper._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&mainComponentUpper);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&component);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&component,"CPACK_RPM_DEBUGINFO_PACKAGE",
                   (allocator<char> *)&mainComponentUpper);
        cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&component,"ON");
        goto LAB_0015fcd3;
      }
    }
  }
  else {
LAB_0015fcd3:
    std::__cxx11::string::~string((string *)&component);
  }
  if (pcVar14 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&component,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE",
               (allocator<char> *)&mainComponentUpper);
    bVar7 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&component);
    if (!bVar7) {
      std::__cxx11::string::~string((string *)&component);
LAB_001602e1:
      if (ignoreGroup) {
        uVar12 = 1;
        for (p_Var17 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_left;
            (_Rb_tree_header *)p_Var17 !=
            &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
          uVar13 = PackageOnePack(this,&initialTopLevel,(string *)(p_Var17 + 1));
          uVar12 = uVar12 & uVar13;
        }
      }
      else {
        uVar12 = 1;
        for (p_Var17 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                       super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var17 !=
            &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header;
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&component);
          poVar16 = std::operator<<((ostream *)&component,"Packaging component group: ");
          poVar16 = std::operator<<(poVar16,(string *)(p_Var17 + 1));
          std::endl<char,std::char_traits<char>>(poVar16);
          pcVar3 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar3,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                          ,0x128,mainComponentUpper._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&mainComponentUpper);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&component);
          uVar13 = PackageOnePack(this,&initialTopLevel,(string *)(p_Var17 + 1));
          uVar12 = uVar12 & uVar13;
        }
        for (p_Var17 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                       _M_header._M_left;
            (_Rb_tree_header *)p_Var17 !=
            &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
          if (*(long *)(p_Var17 + 4) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&component);
            poVar16 = std::operator<<((ostream *)&component,"Component <");
            poVar16 = std::operator<<(poVar16,(string *)(p_Var17 + 2));
            poVar16 = std::operator<<(poVar16,
                                      "> does not belong to any group, package it separately.");
            std::endl<char,std::char_traits<char>>(poVar16);
            pcVar3 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar3,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                            ,0x136,mainComponentUpper._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&mainComponentUpper);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&component);
            uVar13 = PackageOnePack(this,&initialTopLevel,(string *)(p_Var17 + 1));
            uVar12 = uVar12 & uVar13;
          }
        }
      }
      goto LAB_001605d2;
    }
    sVar4 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
            _M_node_count;
    std::__cxx11::string::~string((string *)&component);
    if (sVar4 == 1) goto LAB_001602e1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&component);
    poVar16 = std::operator<<((ostream *)&component,"CPACK_RPM_MAIN_COMPONENT not set but");
    poVar16 = std::operator<<(poVar16," it is mandatory with CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE");
    std::operator<<(poVar16," being set.\n");
    pcVar3 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                    ,0x149,mainComponentUpper._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&mainComponentUpper);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&component);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&component,"CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE",
               (allocator<char> *)&mainComponentUpper);
    bVar7 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&component);
    std::__cxx11::string::~string((string *)&component);
    if (bVar7) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&component,"GENERATE_SPEC_PARTS",(allocator<char> *)&mainComponentUpper);
      cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&component,"ON");
      std::__cxx11::string::~string((string *)&component);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&mainComponentUpper,pcVar14,(allocator<char> *)&component);
    for (sVar19 = 0; mainComponentUpper._M_string_length != sVar19; sVar19 = sVar19 + 1) {
      iVar11 = toupper((int)mainComponentUpper._M_dataplus._M_p[sVar19]);
      mainComponentUpper._M_dataplus._M_p[sVar19] = (char)iVar11;
    }
    if (ignoreGroup) {
      p_Var1 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
      p_Var17 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      local_260 = 1;
      local_268 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var17 != p_Var1;
          p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
        std::__cxx11::string::string((string *)&component,(string *)(p_Var17 + 1));
        sVar19 = component._M_string_length;
        _Var5 = component._M_dataplus;
        for (sVar18 = 0; sVar19 != sVar18; sVar18 = sVar18 + 1) {
          iVar11 = toupper((int)_Var5._M_p[sVar18]);
          _Var5._M_p[sVar18] = (char)iVar11;
        }
        _Var10 = std::operator==(&mainComponentUpper,&component);
        p_Var15 = p_Var17;
        if (!_Var10) {
          uVar12 = PackageOnePack(this,&initialTopLevel,(string *)(p_Var17 + 1));
          local_260 = local_260 & uVar12;
          p_Var15 = local_268;
        }
        local_268 = p_Var15;
        std::__cxx11::string::~string((string *)&component);
      }
      uVar12 = 0;
      if (local_260 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&component,"GENERATE_SPEC_PARTS",(allocator<char> *)&component_4);
        cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&component,"OFF");
        std::__cxx11::string::~string((string *)&component);
        if ((_Rb_tree_header *)local_268 == p_Var1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&component);
          poVar16 = std::operator<<((ostream *)&component,"CPACK_RPM_MAIN_COMPONENT set");
          std::operator<<(poVar16," to non existing component.\n");
          pcVar3 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar3,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                          ,0x119,component_4._M_dataplus._M_p);
LAB_001605b1:
          uVar12 = 0;
          std::__cxx11::string::~string((string *)&component_4);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&component);
        }
        else {
          uVar12 = PackageOnePack(this,&initialTopLevel,(string *)(local_268 + 1));
        }
      }
    }
    else {
      local_268._0_4_ = 1;
      p_Var1 = &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header;
      p_Var15 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      local_210 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var15 != p_Var1;
          p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
        packageName = p_Var15 + 1;
        std::__cxx11::string::string((string *)&component_4,(string *)packageName);
        sVar19 = component_4._M_string_length;
        _Var5 = component_4._M_dataplus;
        for (sVar18 = 0; sVar19 != sVar18; sVar18 = sVar18 + 1) {
          iVar11 = toupper((int)_Var5._M_p[sVar18]);
          _Var5._M_p[sVar18] = (char)iVar11;
        }
        _Var10 = std::operator==(&mainComponentUpper,&component_4);
        p_Var6 = p_Var15;
        if (!_Var10) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&component);
          poVar16 = std::operator<<((ostream *)&component,"Packaging component group: ");
          poVar16 = std::operator<<(poVar16,(string *)packageName);
          std::endl<char,std::char_traits<char>>(poVar16);
          pcVar3 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar3,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                          ,0xcd,local_208._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&component);
          uVar12 = PackageOnePack(this,&initialTopLevel,(string *)packageName);
          local_268._0_4_ = (uint)local_268 & uVar12;
          p_Var6 = local_210;
        }
        local_210 = p_Var6;
        std::__cxx11::string::~string((string *)&component_4);
      }
      p_Var2 = &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
      p_Var17 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      local_218 = &p_Var2->_M_header;
      for (; (_Rb_tree_header *)p_Var17 != p_Var2;
          p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
        if (*(long *)(p_Var17 + 4) == 0) {
          std::__cxx11::string::string((string *)&component_4,(string *)(p_Var17 + 1));
          sVar19 = component_4._M_string_length;
          _Var5 = component_4._M_dataplus;
          for (sVar18 = 0; sVar19 != sVar18; sVar18 = sVar18 + 1) {
            iVar11 = toupper((int)_Var5._M_p[sVar18]);
            _Var5._M_p[sVar18] = (char)iVar11;
          }
          _Var10 = std::operator==(&mainComponentUpper,&component_4);
          p_Var15 = p_Var17;
          if (!_Var10) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&component);
            poVar16 = std::operator<<((ostream *)&component,"Component <");
            poVar16 = std::operator<<(poVar16,(string *)(p_Var17 + 2));
            poVar16 = std::operator<<(poVar16,
                                      "> does not belong to any group, package it separately.");
            std::endl<char,std::char_traits<char>>(poVar16);
            pcVar3 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            cmCPackLog::Log(pcVar3,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                            ,0xe7,local_208._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&component);
            uVar12 = PackageOnePack(this,&initialTopLevel,(string *)(p_Var17 + 1));
            local_268._0_4_ = (uint)local_268 & uVar12;
            p_Var15 = local_218;
          }
          local_218 = p_Var15;
          std::__cxx11::string::~string((string *)&component_4);
        }
      }
      uVar12 = 0;
      if ((uint)local_268 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&component,"GENERATE_SPEC_PARTS",(allocator<char> *)&component_4);
        cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&component,"OFF");
        std::__cxx11::string::~string((string *)&component);
        if (((_Rb_tree_header *)local_210 == p_Var1) &&
           (local_210 = local_218, (_Rb_tree_header *)local_218 == p_Var2)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&component);
          poVar16 = std::operator<<((ostream *)&component,"CPACK_RPM_MAIN_COMPONENT set");
          std::operator<<(poVar16," to non existing component.\n");
          pcVar3 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar3,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                          ,0xf6,component_4._M_dataplus._M_p);
          goto LAB_001605b1;
        }
        uVar12 = PackageOnePack(this,&initialTopLevel,(string *)(local_210 + 1));
      }
    }
    std::__cxx11::string::~string((string *)&mainComponentUpper);
LAB_001605d2:
    if (uVar12 != 0) {
      AddGeneratedPackageNames(this);
      goto LAB_001605e2;
    }
  }
  uVar12 = 0;
LAB_001605e2:
  std::__cxx11::string::~string((string *)&initialTopLevel);
  return uVar12;
}

Assistant:

int cmCPackRPMGenerator::PackageComponents(bool ignoreGroup)
{
  int retval = 1;
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  const char* mainComponent = this->GetOption("CPACK_RPM_MAIN_COMPONENT");

  if (this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE") &&
      !this->IsOn("CPACK_RPM_DEBUGINFO_PACKAGE")) {
    // check if we need to set CPACK_RPM_DEBUGINFO_PACKAGE because non of
    // the components is setting per component debuginfo package variable
    bool shouldSet = true;

    if (ignoreGroup) {
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        std::string component(compIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (this->IsOn("CPACK_RPM_" + compIt->first + "_DEBUGINFO_PACKAGE") ||
            this->IsOn("CPACK_RPM_" + component + "_DEBUGINFO_PACKAGE")) {
          shouldSet = false;
          break;
        }
      }
    } else {
      std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
      for (compGIt = this->ComponentGroups.begin();
           compGIt != this->ComponentGroups.end(); ++compGIt) {
        std::string component(compGIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (this->IsOn("CPACK_RPM_" + compGIt->first + "_DEBUGINFO_PACKAGE") ||
            this->IsOn("CPACK_RPM_" + component + "_DEBUGINFO_PACKAGE")) {
          shouldSet = false;
          break;
        }
      }

      if (shouldSet) {
        std::map<std::string, cmCPackComponent>::iterator compIt;
        for (compIt = this->Components.begin();
             compIt != this->Components.end(); ++compIt) {
          // Does the component belong to a group?
          if (compIt->second.Group == nullptr) {
            std::string component(compIt->first);
            std::transform(component.begin(), component.end(),
                           component.begin(), ::toupper);

            if (this->IsOn("CPACK_RPM_" + compIt->first +
                           "_DEBUGINFO_PACKAGE") ||
                this->IsOn("CPACK_RPM_" + component + "_DEBUGINFO_PACKAGE")) {
              shouldSet = false;
              break;
            }
          }
        }
      }
    }

    if (shouldSet) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Setting "
                      << "CPACK_RPM_DEBUGINFO_PACKAGE because "
                      << "CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE is set but "
                      << " none of the "
                      << "CPACK_RPM_<component>_DEBUGINFO_PACKAGE variables "
                      << "are set." << std::endl);
      this->SetOption("CPACK_RPM_DEBUGINFO_PACKAGE", "ON");
    }
  }

  if (mainComponent) {
    if (this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE")) {
      this->SetOption("GENERATE_SPEC_PARTS", "ON");
    }

    std::string mainComponentUpper(mainComponent);
    std::transform(mainComponentUpper.begin(), mainComponentUpper.end(),
                   mainComponentUpper.begin(), ::toupper);

    // The default behavior is to have one package by component group
    // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
    if (!ignoreGroup) {
      std::map<std::string, cmCPackComponentGroup>::iterator mainCompGIt =
        this->ComponentGroups.end();

      std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
      for (compGIt = this->ComponentGroups.begin();
           compGIt != this->ComponentGroups.end(); ++compGIt) {
        std::string component(compGIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (mainComponentUpper == component) {
          // main component will be handled last
          mainCompGIt = compGIt;
          continue;
        }

        cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                      "Packaging component group: " << compGIt->first
                                                    << std::endl);
        retval &= PackageOnePack(initialTopLevel, compGIt->first);
      }
      // Handle Orphan components (components not belonging to any groups)
      std::map<std::string, cmCPackComponent>::iterator mainCompIt =
        this->Components.end();
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        // Does the component belong to a group?
        if (compIt->second.Group == nullptr) {
          std::string component(compIt->first);
          std::transform(component.begin(), component.end(), component.begin(),
                         ::toupper);

          if (mainComponentUpper == component) {
            // main component will be handled last
            mainCompIt = compIt;
            continue;
          }

          cmCPackLogger(
            cmCPackLog::LOG_VERBOSE,
            "Component <"
              << compIt->second.Name
              << "> does not belong to any group, package it separately."
              << std::endl);
          retval &= PackageOnePack(initialTopLevel, compIt->first);
        }
      }

      if (retval) {
        this->SetOption("GENERATE_SPEC_PARTS", "OFF");

        if (mainCompGIt != this->ComponentGroups.end()) {
          retval &= PackageOnePack(initialTopLevel, mainCompGIt->first);
        } else if (mainCompIt != this->Components.end()) {
          retval &= PackageOnePack(initialTopLevel, mainCompIt->first);
        } else {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "CPACK_RPM_MAIN_COMPONENT set"
                          << " to non existing component.\n");
          retval = 0;
        }
      }
    }
    // CPACK_COMPONENTS_IGNORE_GROUPS is set
    // We build 1 package per component
    else {
      std::map<std::string, cmCPackComponent>::iterator mainCompIt =
        this->Components.end();

      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        std::string component(compIt->first);
        std::transform(component.begin(), component.end(), component.begin(),
                       ::toupper);

        if (mainComponentUpper == component) {
          // main component will be handled last
          mainCompIt = compIt;
          continue;
        }

        retval &= PackageOnePack(initialTopLevel, compIt->first);
      }

      if (retval) {
        this->SetOption("GENERATE_SPEC_PARTS", "OFF");

        if (mainCompIt != this->Components.end()) {
          retval &= PackageOnePack(initialTopLevel, mainCompIt->first);
        } else {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "CPACK_RPM_MAIN_COMPONENT set"
                          << " to non existing component.\n");
          retval = 0;
        }
      }
    }
  } else if (!this->IsOn("CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE") ||
             this->Components.size() == 1) {
    // The default behavior is to have one package by component group
    // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
    if (!ignoreGroup) {
      std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
      for (compGIt = this->ComponentGroups.begin();
           compGIt != this->ComponentGroups.end(); ++compGIt) {
        cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                      "Packaging component group: " << compGIt->first
                                                    << std::endl);
        retval &= PackageOnePack(initialTopLevel, compGIt->first);
      }
      // Handle Orphan components (components not belonging to any groups)
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        // Does the component belong to a group?
        if (compIt->second.Group == nullptr) {
          cmCPackLogger(
            cmCPackLog::LOG_VERBOSE,
            "Component <"
              << compIt->second.Name
              << "> does not belong to any group, package it separately."
              << std::endl);
          retval &= PackageOnePack(initialTopLevel, compIt->first);
        }
      }
    }
    // CPACK_COMPONENTS_IGNORE_GROUPS is set
    // We build 1 package per component
    else {
      std::map<std::string, cmCPackComponent>::iterator compIt;
      for (compIt = this->Components.begin(); compIt != this->Components.end();
           ++compIt) {
        retval &= PackageOnePack(initialTopLevel, compIt->first);
      }
    }
  } else {
    cmCPackLogger(
      cmCPackLog::LOG_ERROR,
      "CPACK_RPM_MAIN_COMPONENT not set but"
        << " it is mandatory with CPACK_RPM_DEBUGINFO_SINGLE_PACKAGE"
        << " being set.\n");
    retval = 0;
  }

  if (retval) {
    AddGeneratedPackageNames();
  }

  return retval;
}